

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O3

_Bool arena_bin_refill_slabcur_no_fresh_slab(tsdn_t *tsdn,arena_t *arena,bin_t *bin)

{
  locked_u64_t *plVar1;
  size_t *psVar2;
  edata_t *peVar3;
  
  peVar3 = (edata_t *)(arena->stats).mutex_prof_data[0].tot_wait_time.ns;
  if (peVar3 != (edata_t *)0x0) {
    arena_bin_slabs_full_insert
              ((arena_t *)
               (ulong)(uint)tsdn[0x1d].tsd.
                            cant_access_tsd_items_directly_use_a_getter_or_setter_tcache.bins[0x3f].
                            tstats.nrequests,(bin_t *)arena,peVar3);
  }
  peVar3 = duckdb_je_edata_heap_remove_first
                     ((edata_heap_t *)&(arena->stats).mutex_prof_data[0].max_wait_time);
  if (peVar3 != (edata_t *)0x0) {
    plVar1 = &(arena->stats).pa_shard_stats.pac_stats.decay_muzzy.nmadvise;
    (plVar1->val).repr = (plVar1->val).repr + 1;
    psVar2 = &(arena->stats).pa_shard_stats.pac_stats.retained;
    *psVar2 = *psVar2 - 1;
  }
  (arena->stats).mutex_prof_data[0].tot_wait_time.ns = (uint64_t)peVar3;
  return peVar3 == (edata_t *)0x0;
}

Assistant:

static bool
arena_bin_refill_slabcur_no_fresh_slab(tsdn_t *tsdn, arena_t *arena,
    bin_t *bin) {
	malloc_mutex_assert_owner(tsdn, &bin->lock);
	/* Only called after arena_slab_reg_alloc[_batch] failed. */
	assert(bin->slabcur == NULL || edata_nfree_get(bin->slabcur) == 0);

	if (bin->slabcur != NULL) {
		arena_bin_slabs_full_insert(arena, bin, bin->slabcur);
	}

	/* Look for a usable slab. */
	bin->slabcur = arena_bin_slabs_nonfull_tryget(bin);
	assert(bin->slabcur == NULL || edata_nfree_get(bin->slabcur) > 0);

	return (bin->slabcur == NULL);
}